

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
reserve(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_> *this,
       size_t count)

{
  size_t sVar1;
  Hdr *pHVar2;
  Hdr *pHVar3;
  Hdr *this_00;
  Hdr *dst;
  long in_RSI;
  undefined8 *in_RDI;
  Ret *p;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  size_t bufferSize;
  size_t size;
  Hdr *in_stack_ffffffffffffff78;
  Hdr *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Ptr local_38 [16];
  size_t local_28;
  ulong local_20;
  byte local_1;
  
  local_20 = in_RSI << 4;
  if (in_RDI[1] != 0) {
    sVar1 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]);
    if ((sVar1 == 1) && (local_20 <= *(ulong *)(in_RDI[1] + 0x18))) {
      local_1 = 1;
      goto LAB_00156108;
    }
  }
  local_28 = getAllocSize(0x155f9f);
  pHVar2 = (Hdr *)mem::allocate(0x155fb2);
  ArrayDetails<axl::spy::ThreadState::Ret>::Hdr::Hdr
            (pHVar2,in_stack_ffffffffffffff88,(uintptr_t)in_stack_ffffffffffffff80);
  rc::primeRefCount<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>
            (in_stack_ffffffffffffff80,(FreeFunc *)in_stack_ffffffffffffff78);
  rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>
            ((Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pHVar3 = rc::Ptr::operator_cast_to_Hdr_(local_38);
  if (pHVar3 == (Hdr *)0x0) {
    local_1 = 0;
  }
  else {
    pHVar3 = rc::Ptr::operator_cast_to_Hdr_(local_38);
    ArrayDetails<axl::spy::ThreadState::Ret>::setHdrCount(pHVar3,in_RDI[2]);
    this_00 = rc::Ptr::operator_cast_to_Hdr_(local_38);
    dst = this_00 + 1;
    if (in_RDI[2] != 0) {
      ArrayDetails<axl::spy::ThreadState::Ret>::constructCopy((Ret *)dst,(Ret *)*in_RDI,in_RDI[2]);
    }
    if (in_RDI[1] != 0) {
      rc::RefCount::release((RefCount *)this_00);
    }
    *in_RDI = dst;
    pHVar2 = rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::detach
                       ((Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> *)pHVar2,
                        (RefCount **)pHVar3);
    in_RDI[1] = pHVar2;
    local_1 = 1;
  }
  rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::~Ptr
            ((Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> *)0x156108);
LAB_00156108:
  return (bool)(local_1 & 1);
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}